

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::attribute(xml_node *this,char_t *name_)

{
  bool bVar1;
  xml_attribute_struct *pxVar2;
  
  if (this->_root == (xml_node_struct *)0x0) {
    pxVar2 = (xml_attribute_struct *)0x0;
  }
  else {
    pxVar2 = this->_root->first_attribute;
    while ((pxVar2 != (xml_attribute_struct *)0x0 &&
           ((pxVar2->name == (char_t *)0x0 ||
            (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar2->name), !bVar1))))) {
      pxVar2 = pxVar2->next_attribute;
    }
  }
  return (xml_attribute)pxVar2;
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_) const
	{
		if (!_root) return xml_attribute();

		for (xml_attribute_struct* i = _root->first_attribute; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_attribute(i);
		}

		return xml_attribute();
	}